

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

float __thiscall NULLCMemory::read_float(NULLCMemory *this,NULLCArray buffer,int offset)

{
  bool bVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *error;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar2 = buffer.len;
  pcVar4 = buffer.ptr;
  if (this == (NULLCMemory *)0x0) {
    error = "buffer is empty";
  }
  else if ((int)uVar2 < 0) {
    error = "offset is negative";
  }
  else {
    uVar3 = (uint)buffer.ptr - uVar2;
    pcVar4 = (char *)(ulong)uVar3;
    bVar1 = uVar2 <= (uint)buffer.ptr && uVar3 != 0;
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),bVar1);
    offset = CONCAT31((int3)((uint)offset >> 8),3 < uVar3);
    if (bVar1 && 3 < uVar3) {
      return *(float *)(this + uVar2);
    }
    error = "buffer overflow";
  }
  nullcThrowError(error,pcVar4,uVar2,offset,in_R8,in_R9,in_RAX);
  return 0.0;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}